

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall google::protobuf::UnknownField::DeepCopy(UnknownField *this,UnknownField *other)

{
  string *this_00;
  
  if (this->type_ == 4) {
    this_00 = (string *)operator_new(0x18);
    *(undefined8 *)this_00 = 0;
    *(undefined8 *)(this_00 + 8) = 0;
    *(undefined8 *)(this_00 + 0x10) = 0;
    UnknownFieldSet::InternalMergeFrom((UnknownFieldSet *)this_00,(this->data_).group_);
  }
  else {
    if (this->type_ != 3) {
      return;
    }
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string(this_00,(string *)(this->data_).group_);
  }
  (this->data_).group_ = (UnknownFieldSet *)this_00;
  return;
}

Assistant:

void UnknownField::DeepCopy(const UnknownField& other) {
  (void)other;  // Parameter is used by Google-internal code.
  switch (type()) {
    case UnknownField::TYPE_LENGTH_DELIMITED:
      data_.length_delimited_.string_value =
          new std::string(*data_.length_delimited_.string_value);
      break;
    case UnknownField::TYPE_GROUP: {
      UnknownFieldSet* group = new UnknownFieldSet();
      group->InternalMergeFrom(*data_.group_);
      data_.group_ = group;
      break;
    }
    default:
      break;
  }
}